

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

Expression * __thiscall
soul::HEARTGenerator::getAsReference(HEARTGenerator *this,Expression *e,bool isConstRef)

{
  Expression *pEVar1;
  Expression *pEVar2;
  StructMemberRef *member;
  StructElement *pSVar3;
  ArrayElementRef *subscript;
  ArrayElement *pAVar4;
  CompileMessage CStack_58;
  
  pEVar1 = (Expression *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::VariableRef::typeinfo,0);
  if (pEVar1 != (Expression *)0x0) {
    pEVar2 = (Expression *)pEVar1[1].super_Statement.super_ASTObject._vptr_ASTObject[0xe];
    if (pEVar2 != (Expression *)0x0) {
      return pEVar2;
    }
    if (isConstRef) {
      pEVar2 = evaluateAsConstantExpression(this,pEVar1);
      return pEVar2;
    }
  }
  member = (StructMemberRef *)
           __dynamic_cast(e,&AST::Expression::typeinfo,&AST::StructMemberRef::typeinfo,0);
  if (member != (StructMemberRef *)0x0) {
    pEVar2 = getAsReference(this,(member->object).object,isConstRef);
    pSVar3 = createStructSubElement(this,member,pEVar2);
    return &pSVar3->super_Expression;
  }
  subscript = (ArrayElementRef *)
              __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ArrayElementRef::typeinfo,0);
  if (subscript != (ArrayElementRef *)0x0) {
    pEVar1 = (subscript->object).object;
    if (pEVar1 != (Expression *)0x0) {
      pEVar2 = getAsReference(this,pEVar1,isConstRef);
      pAVar4 = createArraySubElement(this,subscript,pEVar2);
      return &pAVar4->super_Expression;
    }
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  if (isConstRef) {
    pEVar2 = getExpressionAsMutableLocalCopy(this,e);
    return pEVar2;
  }
  CompileMessageHelpers::createMessage<>
            (&CStack_58,syntax,error,
             "This expression cannot be used as the target for an assignment");
  AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&CStack_58,false);
}

Assistant:

heart::Expression& getAsReference (AST::Expression& e, bool isConstRef)
    {
        if (auto v = cast<AST::VariableRef> (e))
        {
            if (v->variable->generatedVariable != nullptr)
                return v->variable->getGeneratedVariable();

            if (isConstRef)
                return evaluateAsConstantExpression (*v);
        }

        if (auto member = cast<AST::StructMemberRef> (e))
            return createStructSubElement (*member, getAsReference (member->object, isConstRef));

        if (auto subscript = cast<AST::ArrayElementRef> (e))
            return createArraySubElement (*subscript, getAsReference (*subscript->object, isConstRef));

        if (isConstRef)
            return getExpressionAsMutableLocalCopy (e);

        e.context.throwError (Errors::expressionNotAssignable());
    }